

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O3

Curl_tree * Curl_splayinsert(curltime i,Curl_tree *t,Curl_tree *node)

{
  long lVar1;
  Curl_tree *pCVar2;
  Curl_tree *pCVar3;
  int iVar4;
  curltime i_00;
  
  i_00.tv_sec = i.tv_sec;
  if (node == (Curl_tree *)0x0) {
    return t;
  }
  iVar4 = i.tv_usec;
  if (t == (Curl_tree *)0x0) {
    node->smaller = (Curl_tree *)0x0;
    node->larger = (Curl_tree *)0x0;
  }
  else {
    i_00._8_8_ = i._8_8_ & 0xffffffff;
    pCVar3 = Curl_splay(i_00,t);
    lVar1 = (pCVar3->key).tv_sec;
    if ((lVar1 == i_00.tv_sec) && ((pCVar3->key).tv_usec == iVar4)) {
      *(undefined4 *)&(node->key).tv_sec = 0xffffffff;
      *(undefined4 *)((long)&(node->key).tv_sec + 4) = 0xffffffff;
      (node->key).tv_usec = -1;
      *(undefined4 *)&(node->key).field_0xc = 0xffffffff;
      node->samen = pCVar3;
      pCVar2 = pCVar3->samep;
      node->samep = pCVar2;
      pCVar2->samen = node;
      goto LAB_005152f0;
    }
    if ((i_00.tv_sec < lVar1) || ((i_00.tv_sec <= lVar1 && (iVar4 < (pCVar3->key).tv_usec)))) {
      node->smaller = pCVar3->smaller;
      node->larger = pCVar3;
      pCVar3->smaller = (Curl_tree *)0x0;
    }
    else {
      node->larger = pCVar3->larger;
      node->smaller = pCVar3;
      pCVar3->larger = (Curl_tree *)0x0;
    }
  }
  (node->key).tv_sec = i_00.tv_sec;
  (node->key).tv_usec = iVar4;
  node->samen = node;
  pCVar3 = node;
LAB_005152f0:
  pCVar3->samep = node;
  return pCVar3;
}

Assistant:

struct Curl_tree *Curl_splayinsert(struct curltime i,
                                   struct Curl_tree *t,
                                   struct Curl_tree *node)
{
  static const struct curltime KEY_NOTUSED = {
    ~0, -1
  }; /* will *NEVER* appear */

  if(!node)
    return t;

  if(t) {
    t = Curl_splay(i, t);
    if(compare(i, t->key) == 0) {
      /* There already exists a node in the tree with the very same key. Build
         a doubly-linked circular list of nodes. We add the new 'node' struct
         to the end of this list. */

      node->key = KEY_NOTUSED; /* we set the key in the sub node to NOTUSED
                                  to quickly identify this node as a subnode */
      node->samen = t;
      node->samep = t->samep;
      t->samep->samen = node;
      t->samep = node;

      return t; /* the root node always stays the same */
    }
  }

  if(!t) {
    node->smaller = node->larger = NULL;
  }
  else if(compare(i, t->key) < 0) {
    node->smaller = t->smaller;
    node->larger = t;
    t->smaller = NULL;

  }
  else {
    node->larger = t->larger;
    node->smaller = t;
    t->larger = NULL;
  }
  node->key = i;

  /* no identical nodes (yet), we are the only one in the list of nodes */
  node->samen = node;
  node->samep = node;
  return node;
}